

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper_test.cpp
# Opt level: O1

string * disp::to_string<double>(string *__return_storage_ptr__,double v)

{
  long lVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  ostringstream ss;
  long *local_1c8;
  long local_1c0;
  long local_1b8;
  long lStack_1b0;
  undefined1 *local_1a8 [2];
  undefined1 local_198 [16];
  ostringstream local_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  std::ostream::_M_insert<double>(v);
  std::__cxx11::stringbuf::str();
  plVar2 = (long *)std::__cxx11::string::replace((ulong)local_1a8,0,(char *)0x0,0x134d96);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_1b8 = *plVar3;
    lStack_1b0 = plVar2[3];
    local_1c8 = &local_1b8;
  }
  else {
    local_1b8 = *plVar3;
    local_1c8 = (long *)*plVar2;
  }
  local_1c0 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_1c8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar4) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8);
  }
  if (local_1a8[0] != local_198) {
    operator_delete(local_1a8[0]);
  }
  std::__cxx11::ostringstream::~ostringstream(local_188);
  std::ios_base::~ios_base(local_118);
  return __return_storage_ptr__;
}

Assistant:

static std::string to_string(T v)
	{
		std::ostringstream ss;
		ss<<v;
		return "to_str(" + ss.str() + ")";
	}